

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing.cpp
# Opt level: O0

Name __thiscall wasm::UniqueNameMapper::getPrefixedName(UniqueNameMapper *this,Name prefix)

{
  uint __val;
  IString IVar1;
  bool bVar2;
  _Self local_c0;
  _Self local_b8 [3];
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Self local_40;
  _Self local_38;
  UniqueNameMapper *local_30;
  UniqueNameMapper *this_local;
  Name prefix_local;
  Name ret;
  
  prefix_local.super_IString.str._M_len = prefix.super_IString.str._M_str;
  this_local = prefix.super_IString.str._M_len;
  local_30 = this;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::find(&this->reverseLabelMapping,(key_type *)&this_local);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
       ::end(&this->reverseLabelMapping);
  bVar2 = std::operator==(&local_38,&local_40);
  if (bVar2) {
    prefix_local.super_IString.str._M_str = (char *)this_local;
    ret.super_IString.str._M_len = prefix_local.super_IString.str._M_len;
  }
  else {
    do {
      IString::toString_abi_cxx11_(&local_80,(IString *)&this_local);
      __val = this->otherIndex;
      this->otherIndex = __val + 1;
      std::__cxx11::to_string(&local_a0,__val);
      std::operator+(&local_60,&local_80,&local_a0);
      wasm::Name::Name((Name *)&prefix_local.super_IString.str._M_str,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      local_b8[0]._M_node =
           (_Base_ptr)
           std::
           map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
           ::find(&this->reverseLabelMapping,(key_type *)&prefix_local.super_IString.str._M_str);
      local_c0._M_node =
           (_Base_ptr)
           std::
           map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
           ::end(&this->reverseLabelMapping);
      bVar2 = std::operator==(local_b8,&local_c0);
    } while (!bVar2);
  }
  IVar1.str._M_str = (char *)ret.super_IString.str._M_len;
  IVar1.str._M_len = (size_t)prefix_local.super_IString.str._M_str;
  return (IString)(IString)IVar1.str;
}

Assistant:

Name UniqueNameMapper::getPrefixedName(Name prefix) {
  if (reverseLabelMapping.find(prefix) == reverseLabelMapping.end()) {
    return prefix;
  }
  // make sure to return a unique name not already on the stack
  while (1) {
    Name ret = prefix.toString() + std::to_string(otherIndex++);
    if (reverseLabelMapping.find(ret) == reverseLabelMapping.end()) {
      return ret;
    }
  }
}